

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GridRenderTestInstance *this)

{
  void **ppvVar1;
  deUint32 numArrayLayers;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  bool bVar3;
  int iVar4;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice pVVar5;
  Allocator *allocator;
  TextureFormat format;
  ProgramBinary *pPVar6;
  GraphicsPipelineBuilder *pGVar7;
  TestLog *pTVar8;
  uint uVar9;
  void *__n;
  ConstPixelBufferAccess *pCVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int x;
  int iVar11;
  TestStatus *pTVar12;
  VkDeviceSize bufferSize;
  LogImageSet *this_00;
  int iVar13;
  int y;
  int iVar14;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  IVec2 renderSize;
  allocator<char> local_67e;
  allocator<char> local_67d;
  allocator<char> local_67c;
  allocator<char> local_67b;
  allocator<char> local_67a;
  allocator<char> local_679;
  VkDevice local_678;
  deUint32 local_66c;
  RefBase<vk::VkCommandBuffer_s_*> local_668;
  TestStatus *local_648;
  undefined1 local_640 [40];
  Surface errorMask;
  ConstPixelBufferAccess local_600;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_5d8;
  string local_5b8;
  undefined8 local_598;
  undefined8 uStack_590;
  deUint32 local_588;
  undefined8 local_578;
  undefined8 uStack_570;
  deUint32 local_568;
  undefined8 local_558;
  undefined8 uStack_550;
  deUint32 local_548;
  ConstPixelBufferAccess local_540;
  string local_518;
  string local_4f8;
  LogImageSet local_4d8;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_498;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_478;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_458;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_438;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_418;
  string local_3f0;
  string local_3d0;
  ConstPixelBufferAccess imageAllLayers;
  Image colorAttachmentImage;
  Buffer colorBuffer;
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  RGBA color;
  LogImage local_118;
  VkImageCreateInfo colorImageCreateInfo;
  
  local_648 = __return_storage_ptr__;
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,3);
  colorAttachmentLayoutBarrier._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ppvVar1 = &colorAttachmentLayoutBarrier.pNext;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
  std::operator<<((ostream *)ppvVar1,
                  "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&colorAttachmentLayoutBarrier,
             (EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar5 = Context::getDevice((this->super_TestInstance).m_context);
  local_640._32_8_ = Context::getUniversalQueue((this->super_TestInstance).m_context);
  local_66c = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  numArrayLayers = (this->m_params).numLayers;
  makeImageCreateInfo(&colorImageCreateInfo,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x11,numArrayLayers
                     );
  iVar14 = (this->m_params).numLayers;
  local_678 = pVVar5;
  Image::Image(&colorAttachmentImage,vk,pVVar5,allocator,&colorImageCreateInfo,
               (MemoryRequirement)0x0);
  iVar13 = renderSize.m_data[1] * renderSize.m_data[0];
  iVar11 = (this->m_params).numLayers;
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar4 = tcu::getPixelSize(format);
  bufferSize = (VkDeviceSize)(iVar13 * iVar11 * iVar4);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize,2);
  pVVar5 = local_678;
  tessellation::Buffer::Buffer
            (&colorBuffer,vk,local_678,allocator,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier
             ,(MemoryRequirement)0x1);
  local_558 = 1;
  uStack_550 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = numArrayLayers;
  local_548 = numArrayLayers;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier,vk,pVVar5,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,(uint)(iVar14 != 1) * 4 + VK_IMAGE_VIEW_TYPE_2D,
                VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
  local_418.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_418.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_418.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_418.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier,vk,pVVar5,
                 VK_FORMAT_R8G8B8A8_UNORM);
  local_5d8.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_5d8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_5d8.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_5d8.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier,vk,pVVar5,
                  (VkRenderPass)local_5d8.m_data.object.m_internal,
                  (VkImageView)local_418.m_data.object.m_internal,renderSize.m_data[0],
                  renderSize.m_data[1],(this->m_params).numLayers);
  local_438.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_438.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_438.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_438.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier);
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentLayoutBarrier,vk,pVVar5);
  local_458.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_458.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_458.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_458.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentLayoutBarrier);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier,vk,pVVar5,
                  local_66c);
  local_478.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_478.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_478.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_478.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier,vk,pVVar5,
             (VkCommandPool)local_478.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_668.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_668.m_data.deleter.m_pool.m_internal._0_4_ = colorAttachmentLayoutBarrier.oldLayout;
  local_668.m_data.deleter.m_pool.m_internal._4_4_ = colorAttachmentLayoutBarrier.newLayout;
  local_668.m_data.object = (VkCommandBuffer_s *)colorAttachmentLayoutBarrier._0_8_;
  local_668.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier);
  memset(&colorAttachmentLayoutBarrier.pNext,0,0xf4);
  colorAttachmentLayoutBarrier.sType = renderSize.m_data[0];
  colorAttachmentLayoutBarrier._4_4_ = renderSize.m_data[1];
  pPVar2 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"vert",(allocator<char> *)local_640);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_118.m_name);
  pGVar7 = GraphicsPipelineBuilder::setShader
                     ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier,vk,pVVar5,
                      VK_SHADER_STAGE_VERTEX_BIT,pPVar6,(VkSpecializationInfo *)0x0);
  pPVar2 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"frag",(allocator<char> *)&local_5b8);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_4d8.m_name);
  pGVar7 = GraphicsPipelineBuilder::setShader
                     (pGVar7,vk,pVVar5,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar6,
                      (VkSpecializationInfo *)0x0);
  pPVar2 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"tesc",(allocator<char> *)&local_4f8);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&local_540);
  pGVar7 = GraphicsPipelineBuilder::setShader
                     (pGVar7,vk,pVVar5,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar6,
                      (VkSpecializationInfo *)0x0);
  pPVar2 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&imageAllLayers,"tese",(allocator<char> *)&local_3d0);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&imageAllLayers);
  pGVar7 = GraphicsPipelineBuilder::setShader
                     (pGVar7,vk,pVVar5,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar6,
                      (VkSpecializationInfo *)0x0);
  pPVar2 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"geom",(allocator<char> *)&local_518);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&local_600);
  pGVar7 = GraphicsPipelineBuilder::setShader
                     (pGVar7,vk,pVVar5,VK_SHADER_STAGE_GEOMETRY_BIT,pPVar6,
                      (VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&color,pGVar7,vk,pVVar5,
             (VkPipelineLayout)local_458.m_data.object.m_internal,
             (VkRenderPass)local_5d8.m_data.object.m_internal);
  local_498.m_data.object.m_internal = (deUint64)_color;
  _color = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&color);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&imageAllLayers);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_118);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder
            ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier);
  beginCommandBuffer(vk,local_668.m_data.object);
  local_578 = 1;
  uStack_570 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = numArrayLayers;
  local_568 = numArrayLayers;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_668.m_data.object,1,0x80,0,0,0,0,0,1,&colorAttachmentLayoutBarrier);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)renderSize.m_data;
  _color = (pointer)0x0;
  beginRenderPass(vk,local_668.m_data.object,(VkRenderPass)local_5d8.m_data.object.m_internal,
                  (VkFramebuffer)local_438.m_data.object.m_internal,
                  (VkRect2D *)&colorAttachmentLayoutBarrier,(Vec4 *)&color);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_668.m_data.object,0,local_498.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_668.m_data.object,1,1,0,0);
  endRenderPass(vk,local_668.m_data.object);
  local_598 = 1;
  uStack_590 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.layerCount = numArrayLayers;
  local_588 = numArrayLayers;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_668.m_data.object,0x400,0x1000,0,0,0,0,0,1,&colorAttachmentLayoutBarrier);
  subresourceLayers._8_8_ = (ulong)(uint)(this->m_params).numLayers << 0x20;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)&colorAttachmentLayoutBarrier,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_668.m_data.object,
             colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
             object.m_internal,6,
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)&colorAttachmentLayoutBarrier);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&colorAttachmentLayoutBarrier,0x1000,0x2000,
             (VkBuffer)
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_668.m_data.object,0x1000,0x4000,0,0,0,1,(int)&colorAttachmentLayoutBarrier,0,0
            );
  endCommandBuffer(vk,local_668.m_data.object);
  submitCommandsAndWait(vk,pVVar5,(VkQueue)local_640._32_8_,local_668.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (vk,pVVar5,
             (VkDeviceMemory)
             ((colorBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  colorAttachmentLayoutBarrier._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&imageAllLayers,(TextureFormat *)&colorAttachmentLayoutBarrier,renderSize.m_data[0],
             renderSize.m_data[1],(this->m_params).numLayers,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  bVar3 = true;
  for (iVar14 = 0; iVar14 < (this->m_params).numLayers; iVar14 = iVar14 + 1) {
    if (bVar3) {
      pTVar8 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      __n = (void *)0x0;
      local_678 = (VkDevice)CONCAT44(local_678._4_4_,iVar14);
      tcu::getSubregion(&local_600,&imageAllLayers,0,0,iVar14,renderSize.m_data[0],
                        renderSize.m_data[1],1);
      tcu::Surface::Surface(&errorMask,local_600.m_size.m_data[0],local_600.m_size.m_data[1]);
      tcu::Surface::getAccess((PixelBufferAccess *)&colorAttachmentLayoutBarrier,&errorMask);
      ppvVar1 = &colorAttachmentLayoutBarrier.pNext;
      _color = (pointer)0x3f80000000000000;
      tcu::clear((PixelBufferAccess *)&colorAttachmentLayoutBarrier,(Vec4 *)&color);
      colorAttachmentLayoutBarrier._0_8_ = pTVar8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,"Verifying output layer ");
      std::ostream::operator<<(ppvVar1,(int)local_678);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                 (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
      bVar3 = false;
      for (iVar14 = 0; iVar14 < local_600.m_size.m_data[1]; iVar14 = iVar14 + 1) {
        for (iVar11 = 0; iVar11 < local_600.m_size.m_data[0]; iVar11 = iVar11 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&colorAttachmentLayoutBarrier,(int)&local_600,iVar11,
                     iVar14);
          tcu::RGBA::RGBA(&color,(Vec4 *)&colorAttachmentLayoutBarrier);
          uVar9 = color.m_value & 0xff00;
          __n = (void *)(ulong)CONCAT31((int3)(uVar9 >> 8),0xf6ff < uVar9);
          if (0xf6ff >= uVar9 || 0x80000 < (color.m_value & 0xff0000)) {
            *(undefined4 *)
             ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar14 + iVar11) * 4) =
                 0xff0000ff;
            bVar3 = true;
            __n = errorMask.m_pixels.m_ptr;
          }
        }
      }
      if (bVar3) {
        colorAttachmentLayoutBarrier._0_8_ = pTVar8;
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&colorAttachmentLayoutBarrier.pNext);
        std::operator<<((ostream *)&colorAttachmentLayoutBarrier.pNext,
                        "Image verification failed, found invalid pixels.");
        pTVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                            (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_640,"ImageVerification",&local_679);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5b8,"Image verification",&local_67a);
        tcu::LogImageSet::LogImageSet(&local_4d8,(string *)local_640,&local_5b8);
        iVar14 = (int)pTVar8;
        tcu::LogImageSet::write(&local_4d8,iVar14,__buf,(size_t)__n);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"Result",&local_67b)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d0,"Rendered result",&local_67c);
        pCVar10 = &local_600;
        tcu::LogImage::LogImage
                  ((LogImage *)&color,&local_4f8,&local_3d0,&local_600,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&color,iVar14,__buf_00,(size_t)pCVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_518,"ErrorMask",&local_67d);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"Error mask",&local_67e);
        pCVar10 = &local_540;
        tcu::Surface::getAccess((PixelBufferAccess *)pCVar10,&errorMask);
        tcu::LogImage::LogImage
                  (&local_118,&local_518,&local_3f0,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_118,iVar14,__buf_01,(size_t)pCVar10);
        tcu::TestLog::endImageSet(pTVar8);
        tcu::LogImage::~LogImage(&local_118);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_518);
        tcu::LogImage::~LogImage((LogImage *)&color);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_4f8);
        tcu::LogImageSet::~LogImageSet(&local_4d8);
        std::__cxx11::string::~string((string *)&local_5b8);
        this_00 = (LogImageSet *)local_640;
      }
      else {
        colorAttachmentLayoutBarrier._0_8_ = pTVar8;
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&colorAttachmentLayoutBarrier.pNext);
        std::operator<<((ostream *)&colorAttachmentLayoutBarrier.pNext,"Image valid.");
        pTVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                            (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4d8,"ImageVerification",(allocator<char> *)&local_4f8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_540,"Image verification",(allocator<char> *)&local_3d0);
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)&local_118,&local_4d8.m_name,(string *)&local_540);
        tcu::LogImageSet::write((LogImageSet *)&local_118,(int)pTVar8,__buf_02,(size_t)__n);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_640,"Result",(allocator<char> *)&local_518);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5b8,"Rendered result",(allocator<char> *)&local_3f0);
        pCVar10 = &local_600;
        tcu::LogImage::LogImage
                  ((LogImage *)&color,(string *)local_640,&local_5b8,&local_600,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&color,(int)pTVar8,__buf_03,(size_t)pCVar10);
        tcu::TestLog::endImageSet(pTVar8);
        tcu::LogImage::~LogImage((LogImage *)&color);
        std::__cxx11::string::~string((string *)&local_5b8);
        std::__cxx11::string::~string((string *)local_640);
        tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_118);
        std::__cxx11::string::~string((string *)&local_540);
        this_00 = &local_4d8;
      }
      std::__cxx11::string::~string((string *)this_00);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&colorAttachmentLayoutBarrier.pNext);
      bVar3 = (bool)(bVar3 ^ 1);
      tcu::Surface::~Surface(&errorMask);
      iVar14 = (int)local_678;
    }
    else {
      bVar3 = false;
    }
  }
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&colorAttachmentLayoutBarrier,"OK",(allocator<char> *)&color);
    pTVar12 = local_648;
    tcu::TestStatus::pass(local_648,(string *)&colorAttachmentLayoutBarrier);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&colorAttachmentLayoutBarrier,"Image comparison failed",
               (allocator<char> *)&color);
    pTVar12 = local_648;
    tcu::TestStatus::fail(local_648,(string *)&colorAttachmentLayoutBarrier);
  }
  std::__cxx11::string::~string((string *)&colorAttachmentLayoutBarrier);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_498);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_668);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_478);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_458);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_438);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_5d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_418);
  tessellation::Buffer::~Buffer(&colorBuffer);
  Image::~Image(&colorAttachmentImage);
  return pTVar12;
}

Assistant:

tcu::TestStatus GridRenderTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER);

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
		<< tcu::TestLog::EndMessage;

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Color attachment

	const tcu::IVec2			  renderSize			   = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat			   = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageAllLayersRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, m_params.numLayers);
	const VkImageCreateInfo		  colorImageCreateInfo	   = makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, m_params.numLayers);
	const VkImageViewType		  colorAttachmentViewType  = (m_params.numLayers == 1 ? VK_IMAGE_VIEW_TYPE_2D : VK_IMAGE_VIEW_TYPE_2D_ARRAY);
	const Image					  colorAttachmentImage	   (vk, device, allocator, colorImageCreateInfo, MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification (big enough for all layers).

	const VkDeviceSize	colorBufferSizeBytes	= renderSize.x()*renderSize.y() * m_params.numLayers * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Pipeline: no vertex input attributes nor descriptors.

	const Unique<VkImageView>		colorAttachmentView(makeImageView						(vk, device, *colorAttachmentImage, colorAttachmentViewType, colorFormat, colorImageAllLayersRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass						(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer						(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), m_params.numLayers));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayoutWithoutDescriptors(vk, device));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool						(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer				(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline (GraphicsPipelineBuilder()
		.setRenderSize	(renderSize)
		.setShader		(vk, device, VK_SHADER_STAGE_VERTEX_BIT,				  m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				  m_context.getBinaryCollection().get("frag"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	  m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				  m_context.getBinaryCollection().get("geom"), DE_NULL)
		.build			(vk, device, *pipelineLayout, *renderPass));

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageAllLayersRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);

	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageAllLayersRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkImageSubresourceLayers subresourceLayers = makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, m_params.numLayers);
		const VkBufferImageCopy		   copyRegion		 = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), subresourceLayers);
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		const Allocation& alloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), colorBufferSizeBytes);

		const tcu::ConstPixelBufferAccess imageAllLayers(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), m_params.numLayers, alloc.getHostPtr());

		bool allOk = true;
		for (int ndx = 0; ndx < m_params.numLayers; ++ndx)
			allOk = allOk && verifyResultLayer(m_context.getTestContext().getLog(),
											   tcu::getSubregion(imageAllLayers, 0, 0, ndx, renderSize.x(), renderSize.y(), 1),
											   ndx);

		return (allOk ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
	}
}